

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  uint8_t *puVar1;
  size_t sVar2;
  size_t sVar3;
  int iVar4;
  size_t delta;
  size_t sVar5;
  
  delta = pubkey.len;
  iVar4 = ptls_buffer_reserve(buf,2);
  if (iVar4 == 0) {
    *(uint16_t *)(buf->base + buf->off) = group << 8 | group >> 8;
    buf->off = buf->off + 2;
    iVar4 = ptls_buffer_reserve(buf,2);
    if (iVar4 == 0) {
      puVar1 = buf->base;
      sVar2 = buf->off;
      (puVar1 + sVar2)[0] = '\0';
      (puVar1 + sVar2)[1] = '\0';
      sVar3 = buf->off;
      sVar2 = sVar3 + 2;
      buf->off = sVar2;
      sVar5 = sVar2;
      if (delta != 0) {
        iVar4 = ptls_buffer_reserve(buf,delta);
        if (iVar4 != 0) {
          return iVar4;
        }
        memcpy(buf->base + buf->off,pubkey.base,delta);
        sVar5 = delta + buf->off;
        buf->off = sVar5;
      }
      buf->base[sVar3] = (uint8_t)(sVar5 - sVar2 >> 8);
      buf->base[sVar3 + 1] = (uint8_t)(sVar5 - sVar2);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}